

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * get_file(string *__return_storage_ptr__,string *message)

{
  FileManager *this;
  string local_78;
  undefined1 local_51;
  string local_50 [8];
  string data;
  FileManager *f;
  string *message_local;
  string *result;
  
  this = (FileManager *)operator_new(0x20);
  FileManager::FileManager(this);
  std::__cxx11::string::string(local_50);
  local_51 = 0;
  std::__cxx11::string::string((string *)&local_78,(string *)message);
  FileManager::get_file(__return_storage_ptr__,this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (this != (FileManager *)0x0) {
    FileManager::~FileManager(this);
    operator_delete(this,0x20);
  }
  local_51 = 1;
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string get_file(const std::string &message) {
    auto f = new FileManager;
    std::string data;
    auto result = f->get_file(message);
    delete f;
    return result;
}